

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_metric.hpp
# Opt level: O0

void ylt::metric::detail::stat_metric(void)

{
  int iVar1;
  basic_static_counter<long> *this;
  long in_stack_ffffffffffffff68;
  basic_static_counter<long> *in_stack_ffffffffffffff70;
  __atomic_base<long> *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff90;
  thread_local_value<long> *in_stack_ffffffffffffff98;
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  string local_31;
  
  if (stat_metric()::user_metric_count == '\0') {
    iVar1 = __cxa_guard_acquire(&stat_metric()::user_metric_count);
    if (iVar1 != 0) {
      in_stack_ffffffffffffff98 =
           (thread_local_value<long> *)
           static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
      in_stack_ffffffffffffff90 = &local_31;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      static_metric_manager<ylt::metric::ylt_system_tag_t>::
      get_metric_static<ylt::metric::basic_static_gauge<long>>
                ((static_metric_manager<ylt::metric::ylt_system_tag_t> *)in_stack_ffffffffffffff98,
                 in_stack_ffffffffffffff90);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff70);
      std::allocator<char>::~allocator((allocator<char> *)&local_31);
      __cxa_atexit(std::shared_ptr<ylt::metric::basic_static_gauge<long>_>::~shared_ptr,
                   &stat_metric::user_metric_count,&__dso_handle);
      __cxa_guard_release(&stat_metric()::user_metric_count);
    }
  }
  std::
  __shared_ptr_access<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x27506a);
  std::__atomic_base::operator_cast_to_long(in_stack_ffffffffffffff78);
  basic_static_counter<long>::update(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (stat_metric()::user_metric_label_count == '\0') {
    iVar1 = __cxa_guard_acquire(&stat_metric()::user_metric_label_count);
    if (iVar1 != 0) {
      static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      static_metric_manager<ylt::metric::ylt_system_tag_t>::
      get_metric_static<ylt::metric::basic_static_gauge<long>>
                ((static_metric_manager<ylt::metric::ylt_system_tag_t> *)in_stack_ffffffffffffff98,
                 in_stack_ffffffffffffff90);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff70);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa7);
      __cxa_atexit(std::shared_ptr<ylt::metric::basic_static_gauge<long>_>::~shared_ptr,
                   &stat_metric::user_metric_label_count,&__dso_handle);
      __cxa_guard_release(&stat_metric()::user_metric_label_count);
    }
  }
  this = &std::
          __shared_ptr_access<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x27513b)->super_basic_static_counter<long>;
  thread_local_value<long>::value(in_stack_ffffffffffffff98);
  basic_static_counter<long>::update(this,in_stack_ffffffffffffff68);
  return;
}

Assistant:

inline void stat_metric() {
  static auto user_metric_count =
      system_metric_manager::instance().get_metric_static<gauge_t>(
          "ylt_user_metric_count");
  user_metric_count->update(metric::metric_t::g_user_metric_count);

  static auto user_metric_label_count =
      system_metric_manager::instance().get_metric_static<gauge_t>(
          "ylt_user_metric_labels");
  user_metric_label_count->update(
      dynamic_metric::g_user_metric_label_count->value());
}